

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBoxPrivate::updateEdit(QAbstractSpinBoxPrivate *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  qsizetype qVar4;
  longlong *min;
  qsizetype qVar5;
  Promoted<long_long,_int> PVar6;
  byte bVar7;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int selsize;
  bool empty;
  QAbstractSpinBox *q;
  int cursor;
  QString newText;
  QSignalBlocker blocker;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QAbstractSpinBoxPrivate *in_stack_fffffffffffffea0;
  QStringBuilder<QString_&,_QString> *in_stack_fffffffffffffea8;
  QSignalBlocker *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  QString local_108;
  long local_f0;
  qsizetype local_e8;
  QString local_e0;
  int local_c4;
  undefined1 local_90 [96];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->type != UnknownType) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = specialValue(in_stack_fffffffffffffea0);
    if (bVar1) {
      QString::QString((QString *)in_stack_fffffffffffffea0,
                       (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    else {
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0xd8))(local_90,in_RDI,&in_RDI->value);
      ::operator+((QString *)in_stack_fffffffffffffea8,(QString *)in_stack_fffffffffffffea0);
      ::operator+(in_stack_fffffffffffffea8,(QString *)in_stack_fffffffffffffea0);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)0x68b798);
      QStringBuilder<QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<QString_&,_QString> *)0x68b7ae);
      QString::~QString((QString *)0x68b7c4);
    }
    QLineEdit::displayText((QLineEdit *)in_stack_fffffffffffffea8);
    bVar2 = ::operator==((QString *)in_stack_fffffffffffffea0,
                         (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar1 = true;
    if (!bVar2) {
      bVar1 = (*(ushort *)&in_RDI->field_0x3d0 >> 7 & 1) != 0;
    }
    QString::~QString((QString *)0x68b835);
    if (!bVar1) {
      QLineEdit::text((QLineEdit *)in_stack_fffffffffffffea8);
      bVar3 = QString::isEmpty((QString *)0x68b872);
      QString::~QString((QString *)0x68b883);
      bVar7 = bVar3 & 1;
      local_c4 = QLineEdit::cursorPosition((QLineEdit *)in_stack_fffffffffffffea0);
      QLineEdit::selectedText((QLineEdit *)in_stack_fffffffffffffea8);
      qVar4 = QString::size(&local_e0);
      QString::~QString((QString *)0x68b8df);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QSignalBlocker::QSignalBlocker(in_stack_fffffffffffffeb0,(QObject *)in_stack_fffffffffffffea8)
      ;
      QLineEdit::setText((QLineEdit *)in_stack_fffffffffffffea0,
                         (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      bVar1 = specialValue(in_stack_fffffffffffffea0);
      if (!bVar1) {
        local_e8 = QString::size(&in_RDI->prefix);
        QLineEdit::displayText((QLineEdit *)in_stack_fffffffffffffea8);
        min = (longlong *)QString::size(&local_108);
        qVar5 = QString::size(&in_RDI->suffix);
        local_f0 = (long)min - qVar5;
        PVar6 = qBound<long_long,int>
                          (min,(int *)in_stack_fffffffffffffea8,
                           (longlong *)in_stack_fffffffffffffea0);
        local_c4 = (int)PVar6;
        QString::~QString((QString *)0x68b9d6);
        if ((int)qVar4 < 1) {
          if (bVar7 == 0) {
            in_stack_fffffffffffffea0 = (QAbstractSpinBoxPrivate *)(long)local_c4;
          }
          else {
            in_stack_fffffffffffffea0 = (QAbstractSpinBoxPrivate *)QString::size(&in_RDI->prefix);
          }
          QLineEdit::setCursorPosition
                    ((QLineEdit *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        }
        else {
          QLineEdit::setSelection
                    ((QLineEdit *)CONCAT17(bVar3,in_stack_fffffffffffffeb8),
                     (int)((ulong)min >> 0x20),(int)min);
        }
      }
      QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_fffffffffffffea0);
    }
    QString::~QString((QString *)0x68ba77);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateEdit()
{
    Q_Q(QAbstractSpinBox);
    if (type == QMetaType::UnknownType)
        return;
    const QString newText = specialValue() ? specialValueText : prefix + textFromValue(value) + suffix;
    if (newText == edit->displayText() || cleared)
        return;

    const bool empty = edit->text().isEmpty();
    int cursor = edit->cursorPosition();
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);
    edit->setText(newText);

    if (!specialValue()) {
        cursor = qBound(prefix.size(), cursor, edit->displayText().size() - suffix.size());

        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
        } else {
            edit->setCursorPosition(empty ? prefix.size() : cursor);
        }
    }
    q->update();
}